

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall
embree::XMLWriter::store_array_text<embree::SceneGraph::TriangleMeshNode::Triangle>
          (XMLWriter *this,char *name,
          vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          *vec)

{
  int __oflag;
  size_t i;
  ulong uVar1;
  long lVar2;
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string(local_50,name,&local_71);
  open(this,(char *)local_50,__oflag);
  std::__cxx11::string::~string(local_50);
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)(((long)(vec->
                             super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vec->
                            super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0xc); uVar1 = uVar1 + 1) {
    tab(this);
    store_array_elt(this,(Triangle *)
                         ((long)&((vec->
                                  super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->v0 + lVar2));
    lVar2 = lVar2 + 0xc;
  }
  std::__cxx11::string::string(local_70,name,&local_71);
  close(this,(int)local_70);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }